

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,mp::BasicProblem<mp::BasicProblemParams<int>>::VarNamer>::
WriteBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
          (ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
           *this,BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                 e)

{
  BasicStringRef<char> value;
  int iVar1;
  ExprBase EVar2;
  BasicWriter<char> *this_00;
  ExprBase in_RDI;
  undefined1 uVar3;
  bool right_associative;
  int prec;
  undefined7 in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffff9f;
  BasicWriter<char> *in_stack_ffffffffffffffa0;
  ExprBase in_stack_ffffffffffffffb0;
  Kind kind;
  BasicWriter<char> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_RDI.impl_,
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )in_stack_ffffffffffffffb0.impl_,
             (type_conflict)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  kind = SUB84(in_stack_ffffffffffffffb0.impl_,4);
  iVar1 = ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
          ::precedence((Expr)0x18133d);
  uVar3 = iVar1 == 0xb;
  EVar2.impl_ = (Impl *)BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                        ::lhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
                               *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
         *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),(NumericExpr)in_RDI.impl_,
        in_stack_ffffffffffffffe4);
  this_00 = fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9f);
  internal::ExprBase::kind((ExprBase *)0x1813a8);
  mp::expr::str(kind);
  fmt::BasicStringRef<char>::BasicStringRef
            ((BasicStringRef<char> *)this_00,
             (char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  value.size_._0_7_ = in_stack_ffffffffffffffd0;
  value.data_ = (char *)EVar2.impl_;
  value.size_._7_1_ = uVar3;
  fmt::BasicWriter<char>::operator<<(in_stack_ffffffffffffffc0,value);
  fmt::BasicWriter<char>::operator<<(this_00,in_stack_ffffffffffffff9f);
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  ::rhs((BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
         *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>::
  Visit((ExprWriter<mp::internal::ExprTypes,_mp::BasicProblem<mp::BasicProblemParams<int>_>::VarNamer>
         *)CONCAT44(iVar1,in_stack_ffffffffffffffe8),(NumericExpr)in_RDI.impl_,
        in_stack_ffffffffffffffe4);
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::WriteBinary(ExprType e) {
  int prec = precedence(e);
  bool right_associative = prec == prec::EXPONENTIATION;
  Visit(e.lhs(), prec + (right_associative ? 1 : 0));
  writer_ << ' ' << str(e.kind()) << ' ';
  Visit(e.rhs(), prec + (right_associative ? 0 : 1));
}